

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall
fasttext::Dictionary::Dictionary(Dictionary *this,shared_ptr<fasttext::Args> *args,istream *in)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)this,
             &args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>);
  this->ntokens_ = 0;
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  this->word2int_ = (vector<int,_std::allocator<int>_>)auVar2._0_24_;
  (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar2._24_8_;
  *(undefined1 (*) [32])
   &(this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar2;
  *(undefined1 (*) [32])
   ((long)&(this->pdiscard_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = ZEXT1632(ZEXT816(0) << 0x40);
  this->pruneidx_size_ = -1;
  (this->pruneidx_)._M_h._M_buckets = &(this->pruneidx_)._M_h._M_single_bucket;
  (this->pruneidx_)._M_h._M_bucket_count = 1;
  auVar1 = ZEXT416(0) << 0x40;
  (this->pruneidx_)._M_h._M_before_begin = (__node_base)auVar1._0_8_;
  (this->pruneidx_)._M_h._M_element_count = auVar1._8_8_;
  (this->pruneidx_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->pruneidx_)._M_h._M_rehash_policy._M_next_resize = auVar1;
  load(this,in);
  return;
}

Assistant:

Dictionary::Dictionary(std::shared_ptr<Args> args, std::istream& in)
    : args_(args),
      size_(0),
      nwords_(0),
      nlabels_(0),
      ntokens_(0),
      pruneidx_size_(-1) {
  load(in);
}